

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void eval_literal(lyxp_expr *exp,uint16_t *exp_idx,lyxp_set *set)

{
  char *pcVar1;
  char *pcVar2;
  lyxp_set *set_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if (set != (lyxp_set *)0x0) {
    if (exp->tok_len[*exp_idx] == 2) {
      set_fill_string(set,"",0);
    }
    else {
      set_fill_string(set,exp->expr + (int)(exp->expr_pos[*exp_idx] + 1),exp->tok_len[*exp_idx] - 2)
      ;
    }
  }
  pcVar1 = "skipped";
  if (set != (lyxp_set *)0x0) {
    pcVar1 = "parsed";
  }
  pcVar2 = print_token(exp->tokens[*exp_idx]);
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_literal",pcVar1,pcVar2,(ulong)exp->expr_pos[*exp_idx]);
  *exp_idx = *exp_idx + 1;
  return;
}

Assistant:

static void
eval_literal(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyxp_set *set)
{
    if (set) {
        if (exp->tok_len[*exp_idx] == 2) {
            set_fill_string(set, "", 0);
        } else {
            set_fill_string(set, &exp->expr[exp->expr_pos[*exp_idx] + 1], exp->tok_len[*exp_idx] - 2);
        }
    }
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);
}